

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O2

void continuous_dist_test<trng::pareto_dist<double>>(pareto_dist<double> *d)

{
  bool bVar1;
  allocator local_131;
  SourceLineInfo local_130;
  string local_120;
  SectionInfo local_100;
  Section local_b0;
  
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_130.line = 0xd3;
  std::__cxx11::string::string((string *)&local_120,"integrate pdf",&local_131);
  Catch::SectionInfo::SectionInfo(&local_100,&local_130,&local_120);
  Catch::Section::Section(&local_b0,&local_100);
  Catch::SectionInfo::~SectionInfo(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_b0);
  if (bVar1) {
    continuous_dist_test_integrate_pdf<trng::pareto_dist<double>>(d);
  }
  Catch::Section::~Section(&local_b0);
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_130.line = 0xd6;
  std::__cxx11::string::string((string *)&local_120,"icdf",&local_131);
  Catch::SectionInfo::SectionInfo(&local_100,&local_130,&local_120);
  Catch::Section::Section(&local_b0,&local_100);
  Catch::SectionInfo::~SectionInfo(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_b0);
  if (bVar1) {
    continuous_dist_test_icdf<trng::pareto_dist<double>>(d);
  }
  Catch::Section::~Section(&local_b0);
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_130.line = 0xd9;
  std::__cxx11::string::string((string *)&local_120,"chi2 test",&local_131);
  Catch::SectionInfo::SectionInfo(&local_100,&local_130,&local_120);
  Catch::Section::Section(&local_b0,&local_100);
  Catch::SectionInfo::~SectionInfo(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_b0);
  if (bVar1) {
    continuous_dist_test_chi2_test<trng::pareto_dist<double>>(d);
  }
  Catch::Section::~Section(&local_b0);
  local_130.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_130.line = 0xdc;
  std::__cxx11::string::string((string *)&local_120,"streamable",&local_131);
  Catch::SectionInfo::SectionInfo(&local_100,&local_130,&local_120);
  Catch::Section::Section(&local_b0,&local_100);
  Catch::SectionInfo::~SectionInfo(&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  bVar1 = Catch::Section::operator_cast_to_bool(&local_b0);
  if (bVar1) {
    continuous_dist_test_streamable<trng::pareto_dist<double>>(d);
  }
  Catch::Section::~Section(&local_b0);
  return;
}

Assistant:

void continuous_dist_test(T &d) {
  SECTION("integrate pdf") {
    continuous_dist_test_integrate_pdf(d);
  }
  SECTION("icdf") {
    continuous_dist_test_icdf(d);
  }
  SECTION("chi2 test") {
    continuous_dist_test_chi2_test(d);
  }
  SECTION("streamable") {
    continuous_dist_test_streamable(d);
  }
}